

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O0

xy * aom_fast9_detect_nonmax
               (byte *im,int xsize,int ysize,int stride,int b,int **ret_scores,int *ret_num_corners)

{
  xy *__ptr;
  int *__ptr_00;
  xy *nonmax;
  int *scores;
  undefined4 in_stack_00000010;
  int num_corners;
  xy *corners;
  int in_stack_00000040;
  int in_stack_00000044;
  byte *in_stack_00000048;
  undefined4 local_34;
  undefined8 local_8;
  
  __ptr = aom_fast9_detect(in_stack_00000048,in_stack_00000044,in_stack_00000040,im._4_4_,(int)im,
                           (int *)CONCAT44(xsize,ysize));
  if (__ptr == (xy *)0x0) {
    *scores = -1;
    local_8 = (xy *)0x0;
  }
  else {
    __ptr_00 = aom_fast9_score((byte *)CONCAT44(corners._4_4_,corners._0_4_),num_corners,
                               (xy *)scores,nonmax._4_4_,(int)nonmax);
    if ((__ptr_00 == (int *)0x0) && (0 < local_34)) {
      free(__ptr);
      *scores = -1;
      local_8 = (xy *)0x0;
    }
    else {
      local_8 = aom_nonmax_suppression
                          ((xy *)CONCAT44(stride,b),(int *)ret_scores,corners._4_4_,
                           (int **)CONCAT44(num_corners,in_stack_00000010),scores);
      free(__ptr);
      free(__ptr_00);
    }
  }
  return local_8;
}

Assistant:

xy* aom_fast9_detect_nonmax(const byte* im, int xsize, int ysize, int stride, int b,
                            int** ret_scores, int* ret_num_corners)
{
  xy* corners;
  int num_corners;
  int* scores;
  xy* nonmax;

  corners = aom_fast9_detect(im, xsize, ysize, stride, b, &num_corners);
  if(!corners)
  {
    // Memory allocation failure
    *ret_num_corners = -1;
    return NULL;
  }
  // num_corners may be zero.
  scores = aom_fast9_score(im, stride, corners, num_corners, b);
  if(!scores && num_corners > 0)
  {
    // Memory allocation failure
    free(corners);
    *ret_num_corners = -1;
    return NULL;
  }
  nonmax = aom_nonmax_suppression(corners, scores, num_corners, ret_scores, ret_num_corners);

  free(corners);
  free(scores);

  return nonmax;
}